

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InlinePass::GenInlineCode
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars,iterator *call_inst_itr,
          UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr)

{
  _Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  _Var1;
  Function *calleeFn;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  _Var2;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  IRContext *this_01;
  BasicBlock *pBVar3;
  pointer puVar4;
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> _Var5;
  long *plVar6;
  mapped_type pBVar7;
  DebugScope DVar8;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  *this_02;
  bool bVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  int iVar15;
  uint32_t resultId;
  mapped_type *ppFVar16;
  mapped_type *pmVar17;
  Instruction *pIVar18;
  Type *pTVar19;
  undefined4 extraout_var;
  mapped_type *ppBVar20;
  uint uVar21;
  InlinePass *pIVar22;
  DebugInlinedAtContext *inlined_at_ctx_00;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> line_inst;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *blk;
  long *plVar23;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr_00;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block;
  uint32_t entry_blk_label_id;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  callee2caller;
  DebugInlinedAtContext inlined_at_ctx;
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  preCallSB;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  postCallSB;
  DebugScope local_1a8;
  UnderlyingIterator local_1a0;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_198;
  uint32_t local_18c;
  undefined1 local_188 [8];
  undefined1 local_180 [16];
  code *local_170;
  code *local_168;
  undefined1 local_160 [8];
  DebugScope local_158;
  Instruction *local_150;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  *local_148;
  __node_base local_140;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_138;
  __node_base local_100;
  iterator local_f8;
  iterator local_f0;
  undefined1 local_e8 [24];
  pointer local_d0;
  __node_base local_c8;
  _Base_ptr p_Stack_c0;
  float local_b8;
  Instruction *local_b0;
  undefined1 auStack_a8 [16];
  pointer local_98;
  pointer local_90;
  pointer pIStack_88;
  uint32_t local_80;
  pointer local_78;
  undefined1 auStack_70 [8];
  undefined1 local_68 [56];
  
  local_138._M_buckets = &local_138._M_single_bucket;
  local_138._M_bucket_count = 1;
  local_138._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_138._M_element_count = 0;
  local_138._M_rehash_policy._M_max_load_factor = 1.0;
  local_138._M_rehash_policy._M_next_resize = 0;
  local_138._M_single_bucket = (__node_base_ptr)0x0;
  auStack_a8._8_8_ = auStack_70;
  local_98 = (pointer)0x1;
  local_90 = (pointer)0x0;
  pIStack_88 = (pointer)0x0;
  local_80 = 0x3f800000;
  local_78 = (pointer)0x0;
  auStack_70 = (undefined1  [8])0x0;
  local_68._0_8_ = local_68 + 0x30;
  local_68._8_8_ = (pointer)0x1;
  local_68._16_4_ = 0;
  local_68._20_4_ = 0;
  local_68._24_8_ = (pointer)0x0;
  local_68._32_4_ = 1.0;
  local_68._40_8_ = (pointer)0x0;
  local_68._48_8_ =
       (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  pIVar18 = (call_inst_itr->super_iterator).node_;
  _Var1.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)
       (pIVar18->dbg_line_insts_).
       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_e8._0_8_ =
       (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  if (_Var1.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
      (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)
      (pIVar18->dbg_line_insts_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_e8._0_8_ = _Var1.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  }
  local_e8._16_8_ = auStack_a8;
  local_e8._8_8_ = pIVar18->dbg_scope_;
  local_d0 = (pointer)0x1;
  local_c8._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_c0 = (_Base_ptr)0x0;
  local_b8 = 1.0;
  local_b0 = (Instruction *)0x0;
  auStack_a8._0_8_ = (pointer)0x0;
  local_148 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
               *)new_blocks;
  IRContext::InvalidateAnalyses((this->super_Pass).context_,kAnalysisBegin);
  local_1a0._M_current = call_block_itr.iterator_._M_current._M_current;
  local_150 = BasicBlock::GetLoopMergeInst
                        (((call_block_itr.iterator_._M_current._M_current)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl);
  pIVar22 = (InlinePass *)&this->id2function_;
  local_180._0_4_ = Instruction::GetSingleWordOperand((call_inst_itr->super_iterator).node_,2);
  ppFVar16 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)pIVar22,(key_type *)local_180);
  calleeFn = *ppFVar16;
  local_f0.node_ = (call_inst_itr->super_iterator).node_;
  MapParams(pIVar22,calleeFn,(iterator *)&local_f0,
            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)(local_160 + 0x28));
  inlined_at_ctx_00 = (DebugInlinedAtContext *)local_e8;
  uVar13 = 0;
  local_140._M_nxt = (_Hash_node_base *)new_vars;
  bVar12 = CloneAndMapLocals(this,calleeFn,new_vars,
                             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)(local_160 + 0x28),inlined_at_ctx_00);
  if (!bVar12) goto LAB_0058322b;
  pIVar18 = *(Instruction **)
             ((long)(((calleeFn->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t + 8);
  if (pIVar18->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
  }
  _Var2.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       ((((local_1a0._M_current)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ;
  uVar14 = 0;
  local_18c = uVar13;
  if (*(bool *)((long)_Var2.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
               0x2d) == true) {
    uVar14 = Instruction::GetSingleWordOperand
                       ((Instruction *)
                        _Var2.
                        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                        (uint)*(bool *)((long)_Var2.
                                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                              .
                                              super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                              ._M_head_impl + 0x2c));
  }
  pmVar17 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)(local_160 + 0x28),&local_18c);
  *pmVar17 = uVar14;
  _Var2.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       ((((local_1a0._M_current)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ;
  if (*(bool *)((long)_Var2.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
               0x2d) == true) {
    Instruction::GetSingleWordOperand
              ((Instruction *)
               _Var2.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
               (uint)*(bool *)((long)_Var2.
                                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                     _M_head_impl + 0x2c));
  }
  local_198 = &calleeFn->blocks_;
  NewLabel((InlinePass *)local_180,(uint32_t)this);
  pIVar22 = (InlinePass *)0x88;
  local_1a8 = (DebugScope)operator_new(0x88);
  uVar13 = 0;
  *(undefined8 *)local_1a8 = 0;
  ((DebugScope *)((long)local_1a8 + 8))->lexical_scope_ = local_180._0_4_;
  ((DebugScope *)((long)local_1a8 + 8))->inlined_at_ = local_180._4_4_;
  (((Instruction *)((long)local_1a8 + 0x18))->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
  _vptr_IntrusiveNodeBase = (_func_int **)&PTR__Instruction_00b02eb0;
  *(uint32_t *)((long)local_1a8 + 0x48) = 0;
  *(undefined8 *)((long)local_1a8 + 0x3e) = 0;
  *(IRContext **)&(((MessageConsumer *)((long)local_1a8 + 0x38))->super__Function_base)._M_functor =
       (IRContext *)0x0;
  ((DebugScope *)((long)local_1a8 + 0x80))->lexical_scope_ = 0;
  ((DebugScope *)((long)local_1a8 + 0x80))->inlined_at_ = 0;
  (((unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>_>
     *)((long)local_1a8 + 0x70))->_M_h)._M_buckets = (__buckets_ptr)0x0;
  *(pointer *)((long)local_1a8 + 0x78) = (pointer)0x0;
  (((unique_ptr<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
     *)((long)local_1a8 + 0x60))->_M_t).
  super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl =
       (DecorationManager *)0x0;
  (((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
   ((long)local_1a8 + 0x68))->
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((OperandList *)((long)local_1a8 + 0x50))->
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
     *)((long)local_1a8 + 0x58))->_M_t).
  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl =
       (DefUseManager *)0x0;
  *(Instruction **)((long)local_1a8 + 0x20) = (Instruction *)((long)local_1a8 + 0x18);
  *(Instruction **)((long)local_1a8 + 0x28) = (Instruction *)((long)local_1a8 + 0x18);
  *(bool *)&(((unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_> *)
             ((long)local_1a8 + 0x30))->_M_t).
            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl = true;
  (((InstructionList *)((long)local_1a8 + 0x10))->super_IntrusiveList<spvtools::opt::Instruction>).
  _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_00b02f48;
  local_f8.node_ = (call_inst_itr->super_iterator).node_;
  call_block_itr_00.iterator_._M_current = local_1a0._M_current;
  call_block_itr_00.container_ = (UptrVector *)inlined_at_ctx_00;
  MoveInstsBeforeEntryBlock
            (pIVar22,(unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                      *)(auStack_a8 + 8),(BasicBlock *)local_1a8,(iterator *)&local_f8,
             call_block_itr_00);
  if (local_150 != (Instruction *)0x0) {
    pIVar18 = BasicBlock::GetMergeInst
                        ((BasicBlock *)
                         (((local_198->
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t);
    if (pIVar18 == (Instruction *)0x0) goto LAB_00582dc7;
    local_158 = local_1a8;
    local_1a8.lexical_scope_ = 0;
    local_1a8.inlined_at_ = 0;
    AddGuardBlock((InlinePass *)local_180,
                  (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   *)this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)local_148,
                  (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)(local_160 + 0x28),(int)local_160 + 8);
    uVar10 = local_180._0_8_;
    DVar8 = local_1a8;
    local_180._0_8_ = (BasicBlock *)0x0;
    uVar11 = local_180._0_8_;
    local_180._0_4_ = (undefined4)uVar10;
    local_180._4_4_ = SUB84(uVar10,4);
    local_1a8.lexical_scope_ = local_180._0_4_;
    local_1a8.inlined_at_ = local_180._4_4_;
    if (DVar8 != (DebugScope)0x0) {
      local_180._0_8_ = uVar11;
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_1a8,(BasicBlock *)DVar8);
      if ((BasicBlock *)local_180._0_8_ != (BasicBlock *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)local_180,
                   (BasicBlock *)local_180._0_8_);
      }
    }
    local_180._0_4_ = 0;
    local_180._4_4_ = 0;
    if (local_158 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)(local_160 + 8),
                 (BasicBlock *)local_158);
    }
    local_158.lexical_scope_ = 0;
    local_158.inlined_at_ = 0;
    if (local_1a8 != (DebugScope)0x0) goto LAB_00582dc7;
LAB_00583229:
    uVar13 = 0;
    goto LAB_0058322b;
  }
LAB_00582dc7:
  this_00._M_head_impl =
       (calleeFn->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((this_00._M_head_impl)->has_type_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(this_00._M_head_impl,0);
  }
  this_02 = local_148;
  this_01 = (this->super_Pass).context_;
  if ((this_01->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_01);
  }
  pTVar19 = analysis::TypeManager::GetType
                      ((this_01->type_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                       _M_head_impl,uVar13);
  iVar15 = (*pTVar19->_vptr_Type[5])(pTVar19);
  uVar14 = 0;
  if (CONCAT44(extraout_var,iVar15) == 0) {
    uVar14 = CreateReturnVar(this,calleeFn,
                             (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                              *)local_140._M_nxt);
    if (uVar14 != 0) goto LAB_00582e37;
LAB_00583211:
    uVar13 = 0;
  }
  else {
LAB_00582e37:
    local_1a0._M_current._0_4_ = uVar14;
    local_180._0_8_ = local_160 + 0x28;
    local_168 = std::
                _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:639:27)>
                ::_M_invoke;
    local_170 = std::
                _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:639:27)>
                ::_M_manager;
    local_180._8_8_ = this;
    opt::Function::WhileEachInst
              (calleeFn,(function<bool_(spvtools::opt::Instruction_*)> *)local_180,false,false);
    if (local_170 != (code *)0x0) {
      (*local_170)(local_180,local_180,3);
    }
    local_180._8_8_ = (void *)0x0;
    local_180._0_8_ = operator_new(0x20);
    *(DebugScope **)local_180._0_8_ = &local_1a8;
    *(long *)(local_180._0_8_ + 8) = (long)local_160 + 0x28;
    (((InstructionList *)(local_180._0_8_ + 0x10))->super_IntrusiveList<spvtools::opt::Instruction>)
    ._vptr_IntrusiveList = (_func_int **)local_e8;
    (((Instruction *)(local_180._0_8_ + 0x18))->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
    ._vptr_IntrusiveNodeBase = (_func_int **)this;
    local_168 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:652:7)>
                ::_M_invoke;
    local_170 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp:652:7)>
                ::_M_manager;
    opt::Function::ForEachDebugInstructionsInHeader
              (calleeFn,(function<void_(spvtools::opt::Instruction_*)> *)local_180);
    if (local_170 != (code *)0x0) {
      (*local_170)(local_180,local_180,3);
    }
    callee_first_block.iterator_._M_current =
         (local_198->
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    callee_first_block.container_ = local_198;
    bVar12 = InlineEntryBlock(this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                    *)(local_160 + 0x28),
                              (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                               *)&local_1a8,callee_first_block,(DebugInlinedAtContext *)local_e8);
    if (!bVar12) goto LAB_00583211;
    local_160._0_4_ = local_1a8.lexical_scope_;
    local_160._4_4_ = local_1a8.inlined_at_;
    local_1a8.lexical_scope_ = 0;
    local_1a8.inlined_at_ = 0;
    local_198 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 *)call_inst_itr;
    InlineBasicBlocks((InlinePass *)local_180,
                      (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       *)this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)this_02,
                      (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)(local_160 + 0x28),(DebugInlinedAtContext *)local_160,(Function *)local_e8)
    ;
    uVar10 = local_180._0_8_;
    DVar8 = local_1a8;
    local_180._0_8_ = (BasicBlock *)0x0;
    uVar11 = local_180._0_8_;
    local_180._0_4_ = (undefined4)uVar10;
    local_180._4_4_ = SUB84(uVar10,4);
    local_1a8.lexical_scope_ = local_180._0_4_;
    local_1a8.inlined_at_ = local_180._4_4_;
    if (DVar8 != (DebugScope)0x0) {
      local_180._0_8_ = uVar11;
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_1a8,(BasicBlock *)DVar8);
      if ((BasicBlock *)local_180._0_8_ != (BasicBlock *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)local_180,
                   (BasicBlock *)local_180._0_8_);
      }
    }
    pvVar9 = local_198;
    local_180._0_4_ = 0;
    local_180._4_4_ = 0;
    if ((DebugScope)local_160 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_160,(BasicBlock *)local_160);
    }
    local_160 = (undefined1  [8])0x0;
    if (local_1a8 == (DebugScope)0x0) goto LAB_00583229;
    local_188._0_4_ = local_1a8.lexical_scope_;
    local_188._4_4_ = local_1a8.inlined_at_;
    local_1a8.lexical_scope_ = 0;
    local_1a8.inlined_at_ = 0;
    pBVar3 = (calleeFn->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    pIVar18 = (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar18 == (Instruction *)0x0) ||
       ((pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    InlineReturn((InlinePass *)local_180,
                 (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)this,(vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          *)(local_160 + 0x28),
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)this_02,(DebugInlinedAtContext *)local_188,(Function *)local_e8,
                 (Instruction *)calleeFn,
                 (uint32_t)
                 (pBVar3->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    DVar8 = local_1a8;
    local_1a8.lexical_scope_ = local_180._0_4_;
    local_1a8.inlined_at_ = local_180._4_4_;
    if (DVar8 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)&local_1a8,(BasicBlock *)DVar8);
    }
    if ((DebugScope)local_188 != (DebugScope)0x0) {
      std::default_delete<spvtools::opt::BasicBlock>::operator()
                ((default_delete<spvtools::opt::BasicBlock> *)local_188,(BasicBlock *)local_188);
    }
    local_188 = (undefined1  [8])0x0;
    local_100._M_nxt =
         (_Hash_node_base *)
         (pvVar9->
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    uVar14 = (uint32_t)local_1a0._M_current;
    if ((uint32_t)local_1a0._M_current != 0) {
      if (((Instruction *)local_100._M_nxt)->has_result_id_ != true) {
LAB_00583273:
        __assert_fail("resId != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp"
                      ,0x2a6,
                      "bool spvtools::opt::InlinePass::GenInlineCode(std::vector<std::unique_ptr<BasicBlock>> *, std::vector<std::unique_ptr<Instruction>> *, BasicBlock::iterator, UptrVectorIterator<BasicBlock>)"
                     );
      }
      resultId = Instruction::GetSingleWordOperand
                           ((Instruction *)local_100._M_nxt,
                            (uint)((Instruction *)local_100._M_nxt)->has_type_id_);
      if (resultId == 0) goto LAB_00583273;
      puVar4 = (pvVar9->
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
           puVar4[10]._M_t.
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t;
      line_inst._M_head_impl = (BasicBlock *)0x0;
      if ((_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           )_Var5._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl !=
          (BasicBlock *)
          puVar4[0xb]._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t) {
        line_inst._M_head_impl =
             (BasicBlock *)
             _Var5._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      }
      AddLoad(this,uVar13,resultId,uVar14,
              (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&local_1a8,(Instruction *)line_inst._M_head_impl,(DebugScope *)(puVar4 + 0xd));
      local_100._M_nxt =
           (_Hash_node_base *)
           (pvVar9->
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    }
    bVar12 = MoveCallerInstsAfterFunctionCall
                       (this,(unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                              *)(auStack_a8 + 8),
                        (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)local_68,
                        (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         *)&local_1a8,(iterator *)&local_100,
                        (calleeFn->blocks_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (calleeFn->blocks_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if (!bVar12) goto LAB_00583211;
    std::
    vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
              (this_02,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)&local_1a8);
    if ((local_150 != (Instruction *)0x0) &&
       (8 < (ulong)(*(long *)(this_02 + 8) - *(long *)this_02))) {
      MoveLoopMergeInstToFirstBlock
                (this,(vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       *)this_02);
      plVar23 = *(long **)this_02;
      pIVar18 = BasicBlock::GetLoopMergeInst((BasicBlock *)*plVar23);
      uVar21 = (pIVar18->has_result_id_ & 1) + 1;
      if (pIVar18->has_type_id_ == false) {
        uVar21 = (uint)pIVar18->has_result_id_;
      }
      uVar13 = Instruction::GetSingleWordOperand(pIVar18,uVar21 + 1);
      pIVar18 = *(Instruction **)(*plVar23 + 8);
      uVar14 = 0;
      if (pIVar18->has_result_id_ == true) {
        uVar14 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
      }
      if (uVar13 == uVar14) {
        uVar13 = IRContext::TakeNextId((this->super_Pass).context_);
        if (uVar13 == 0) goto LAB_00583211;
        UpdateSingleBlockLoopContinueTarget
                  (this,uVar13,
                   (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                    *)this_02);
      }
    }
    plVar23 = *(long **)this_02;
    plVar6 = *(long **)(this_02 + 8);
    if (plVar23 != plVar6) {
      do {
        pBVar7 = (mapped_type)*plVar23;
        pIVar18 = (pBVar7->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar13 = 0;
        if (pIVar18->has_result_id_ == true) {
          uVar13 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
        }
        local_180._0_4_ = uVar13;
        ppBVar20 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->id2block_,(key_type *)local_180);
        *ppBVar20 = pBVar7;
        plVar23 = plVar23 + 1;
      } while (plVar23 != plVar6);
    }
    IRContext::KillNamesAndDecorates
              ((this->super_Pass).context_,
               (Instruction *)
               (local_198->
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    uVar13 = 1;
  }
  if (local_1a8 != (DebugScope)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)&local_1a8,(BasicBlock *)local_1a8);
  }
LAB_0058322b:
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_e8 + 0x10));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_68);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(auStack_a8 + 8));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_160 + 0x28));
  return SUB41(uVar13,0);
}

Assistant:

bool InlinePass::GenInlineCode(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::vector<std::unique_ptr<Instruction>>* new_vars,
    BasicBlock::iterator call_inst_itr,
    UptrVectorIterator<BasicBlock> call_block_itr) {
  // Map from all ids in the callee to their equivalent id in the caller
  // as callee instructions are copied into caller.
  std::unordered_map<uint32_t, uint32_t> callee2caller;
  // Pre-call same-block insts
  std::unordered_map<uint32_t, Instruction*> preCallSB;
  // Post-call same-block op ids
  std::unordered_map<uint32_t, uint32_t> postCallSB;

  analysis::DebugInlinedAtContext inlined_at_ctx(&*call_inst_itr);

  // Invalidate the def-use chains.  They are not kept up to date while
  // inlining.  However, certain calls try to keep them up-to-date if they are
  // valid.  These operations can fail.
  context()->InvalidateAnalyses(IRContext::kAnalysisDefUse);

  // If the caller is a loop header and the callee has multiple blocks, then the
  // normal inlining logic will place the OpLoopMerge in the last of several
  // blocks in the loop.  Instead, it should be placed at the end of the first
  // block.  We'll wait to move the OpLoopMerge until the end of the regular
  // inlining logic, and only if necessary.
  bool caller_is_loop_header = call_block_itr->GetLoopMergeInst() != nullptr;

  // Single-trip loop continue block
  std::unique_ptr<BasicBlock> single_trip_loop_cont_blk;

  Function* calleeFn = id2function_[call_inst_itr->GetSingleWordOperand(
      kSpvFunctionCallFunctionId)];

  // Map parameters to actual arguments.
  MapParams(calleeFn, call_inst_itr, &callee2caller);

  // Define caller local variables for all callee variables and create map to
  // them.
  if (!CloneAndMapLocals(calleeFn, new_vars, &callee2caller, &inlined_at_ctx)) {
    return false;
  }

  // First block needs to use label of original block
  // but map callee label in case of phi reference.
  uint32_t entry_blk_label_id = calleeFn->begin()->GetLabelInst()->result_id();
  callee2caller[entry_blk_label_id] = call_block_itr->id();
  std::unique_ptr<BasicBlock> new_blk_ptr =
      MakeUnique<BasicBlock>(NewLabel(call_block_itr->id()));

  // Move instructions of original caller block up to call instruction.
  MoveInstsBeforeEntryBlock(&preCallSB, new_blk_ptr.get(), call_inst_itr,
                            call_block_itr);

  if (caller_is_loop_header &&
      (*(calleeFn->begin())).GetMergeInst() != nullptr) {
    // We can't place both the caller's merge instruction and
    // another merge instruction in the same block.  So split the
    // calling block. Insert an unconditional branch to a new guard
    // block.  Later, once we know the ID of the last block,  we
    // will move the caller's OpLoopMerge from the last generated
    // block into the first block. We also wait to avoid
    // invalidating various iterators.
    new_blk_ptr = AddGuardBlock(new_blocks, &callee2caller,
                                std::move(new_blk_ptr), entry_blk_label_id);
    if (new_blk_ptr == nullptr) return false;
  }

  // Create return var if needed.
  const uint32_t calleeTypeId = calleeFn->type_id();
  uint32_t returnVarId = 0;
  analysis::Type* calleeType = context()->get_type_mgr()->GetType(calleeTypeId);
  if (calleeType->AsVoid() == nullptr) {
    returnVarId = CreateReturnVar(calleeFn, new_vars);
    if (returnVarId == 0) {
      return false;
    }
  }

  calleeFn->WhileEachInst([&callee2caller, this](const Instruction* cpi) {
    // Create set of callee result ids. Used to detect forward references
    const uint32_t rid = cpi->result_id();
    if (rid != 0 && callee2caller.find(rid) == callee2caller.end()) {
      const uint32_t nid = context()->TakeNextId();
      if (nid == 0) return false;
      callee2caller[rid] = nid;
    }
    return true;
  });

  // Inline DebugClare instructions in the callee's header.
  calleeFn->ForEachDebugInstructionsInHeader(
      [&new_blk_ptr, &callee2caller, &inlined_at_ctx, this](Instruction* inst) {
        InlineSingleInstruction(
            callee2caller, new_blk_ptr.get(), inst,
            context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                inst->GetDebugScope().GetInlinedAt(), &inlined_at_ctx));
      });

  // Inline the entry block of the callee function.
  if (!InlineEntryBlock(callee2caller, &new_blk_ptr, calleeFn->begin(),
                        &inlined_at_ctx)) {
    return false;
  }

  // Inline blocks of the callee function other than the entry block.
  new_blk_ptr =
      InlineBasicBlocks(new_blocks, callee2caller, std::move(new_blk_ptr),
                        &inlined_at_ctx, calleeFn);
  if (new_blk_ptr == nullptr) return false;

  new_blk_ptr = InlineReturn(callee2caller, new_blocks, std::move(new_blk_ptr),
                             &inlined_at_ctx, calleeFn,
                             &*(calleeFn->tail()->tail()), returnVarId);

  // Load return value into result id of call, if it exists.
  if (returnVarId != 0) {
    const uint32_t resId = call_inst_itr->result_id();
    assert(resId != 0);
    AddLoad(calleeTypeId, resId, returnVarId, &new_blk_ptr,
            call_inst_itr->dbg_line_inst(), call_inst_itr->GetDebugScope());
  }

  // Move instructions of original caller block after call instruction.
  if (!MoveCallerInstsAfterFunctionCall(&preCallSB, &postCallSB, &new_blk_ptr,
                                        call_inst_itr,
                                        calleeFn->begin() != calleeFn->end()))
    return false;

  // Finalize inline code.
  new_blocks->push_back(std::move(new_blk_ptr));

  if (caller_is_loop_header && (new_blocks->size() > 1)) {
    MoveLoopMergeInstToFirstBlock(new_blocks);

    // If the loop was a single basic block previously, update it's structure.
    auto& header = new_blocks->front();
    auto* merge_inst = header->GetLoopMergeInst();
    if (merge_inst->GetSingleWordInOperand(1u) == header->id()) {
      auto new_id = context()->TakeNextId();
      if (new_id == 0) return false;
      UpdateSingleBlockLoopContinueTarget(new_id, new_blocks);
    }
  }

  // Update block map given replacement blocks.
  for (auto& blk : *new_blocks) {
    id2block_[blk->id()] = &*blk;
  }

  // We need to kill the name and decorations for the call, which will be
  // deleted.
  context()->KillNamesAndDecorates(&*call_inst_itr);

  return true;
}